

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O0

Utest * __thiscall
TEST_DoublingFactorCounterTest_AllGreen_TestShell::createTest
          (TEST_DoublingFactorCounterTest_AllGreen_TestShell *this)

{
  TEST_DoublingFactorCounterTest_AllGreen_Test *this_00;
  char *in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe0;
  TEST_DoublingFactorCounterTest_AllGreen_TestShell *this_local;
  
  this_00 = (TEST_DoublingFactorCounterTest_AllGreen_Test *)
            operator_new(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,0);
  TEST_DoublingFactorCounterTest_AllGreen_Test::TEST_DoublingFactorCounterTest_AllGreen_Test
            (this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(DoublingFactorCounterTest, AllGreen)
{
	addPair(Tile::GreenDragon);
	addTriplet(Tile::TwoOfBamboos, false);
	addSequence(Tile::TwoOfBamboos, false);
	addTriplet(Tile::SixOfBamboos, false);
	addTriplet(Tile::EightOfBamboos, false);

	s.selfDrawn();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::AllGreen));
	CHECK_EQUAL(100, r.doubling_factor);
}